

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTest::SetUp(BuildTest *this)

{
  CommandRunner *pCVar1;
  allocator<char> local_4a;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  pCVar1 = (this->builder_).command_runner_._M_t.
           super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
           super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
  (this->builder_).command_runner_._M_t.
  super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
  super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
  super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
       &(this->command_runner_).super_CommandRunner;
  if (pCVar1 != (CommandRunner *)0x0) {
    (*pCVar1->_vptr_CommandRunner[1])();
  }
  AssertParse(&(this->super_StateTestWithBuiltinRules).state_,
              "build cat1: cat in1\nbuild cat2: cat in1 in2\nbuild cat12: cat cat1 cat2\n",
              (ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"in1",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_4a);
  VirtualFileSystem::Create(&this->fs_,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"in2",&local_49);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_4a);
  VirtualFileSystem::Create(&this->fs_,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

virtual void SetUp() {
    StateTestWithBuiltinRules::SetUp();

    builder_.command_runner_.reset(&command_runner_);
    AssertParse(&state_,
"build cat1: cat in1\n"
"build cat2: cat in1 in2\n"
"build cat12: cat cat1 cat2\n");

    fs_.Create("in1", "");
    fs_.Create("in2", "");
  }